

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O0

void acc_stat_win7_one_line_sse4_1
               (uint8_t *dgd,uint8_t *src,int h_start,int h_end,int dgd_stride,__m128i *shuffle,
               int32_t *sumX,int32_t (*sumY) [7],int32_t (*M_int) [7],int32_t (*H_int) [56])

{
  byte bVar1;
  byte bVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int16_t iVar7;
  ushort uVar8;
  long lVar9;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int *in_stack_00000008;
  __m128i kl_1;
  long in_stack_00000020;
  uint8_t D1_1;
  int32_t *H__1;
  uint8_t *dgd_ijk_1;
  uint8_t X1_1;
  uint8_t *dgd_ij_1;
  __m128i kl;
  uint8_t D2;
  uint8_t D1;
  int32_t *H_;
  uint8_t *dgd_ijk;
  uint8_t X2;
  uint8_t X1;
  uint8_t *dgd_ij;
  int has_odd_pixel;
  int h_end_even;
  int l;
  int k;
  int j;
  int wiener_win;
  undefined6 in_stack_ffffffffffffff20;
  byte in_stack_ffffffffffffff26;
  byte in_stack_ffffffffffffff27;
  __m128i *in_stack_ffffffffffffff28;
  uint8_t *in_stack_ffffffffffffff30;
  undefined6 in_stack_ffffffffffffff38;
  byte in_stack_ffffffffffffff3e;
  byte in_stack_ffffffffffffff3f;
  int local_b0;
  int local_ac;
  int local_a8;
  
  for (local_a8 = in_EDX; local_a8 < (int)(in_ECX & 0xfffffffe); local_a8 = local_a8 + 2) {
    in_stack_ffffffffffffff3f = *(byte *)(in_RSI + local_a8);
    in_stack_ffffffffffffff3e = *(byte *)(in_RSI + (local_a8 + 1));
    *in_stack_00000008 =
         (uint)in_stack_ffffffffffffff3f + (uint)in_stack_ffffffffffffff3e + *in_stack_00000008;
    for (local_ac = 0; local_ac < 7; local_ac = local_ac + 1) {
      in_stack_ffffffffffffff30 = (uint8_t *)(in_RDI + local_a8 + (long)(local_ac * in_R8D));
      for (local_b0 = 0; local_b0 < 7; local_b0 = local_b0 + 1) {
        in_stack_ffffffffffffff28 =
             (__m128i *)(in_stack_00000020 + (long)(local_b0 * 7 + local_ac) * 0xe0);
        in_stack_ffffffffffffff27 = in_stack_ffffffffffffff30[local_b0];
        in_stack_ffffffffffffff26 = in_stack_ffffffffffffff30[(long)local_b0 + 1];
        lVar9 = kl_1[0] + (long)local_ac * 0x1c;
        *(uint *)(lVar9 + (long)local_b0 * 4) =
             *(int *)(lVar9 + (long)local_b0 * 4) +
             (uint)in_stack_ffffffffffffff27 + (uint)in_stack_ffffffffffffff26;
        lVar9 = kl_1[1] + (long)local_ac * 0x1c;
        *(uint *)(lVar9 + (long)local_b0 * 4) =
             *(int *)(lVar9 + (long)local_b0 * 4) +
             (uint)in_stack_ffffffffffffff27 * (uint)in_stack_ffffffffffffff3f +
             (uint)in_stack_ffffffffffffff26 * (uint)in_stack_ffffffffffffff3e;
        iVar7 = loadu_int16(in_stack_ffffffffffffff30 + local_b0);
        uVar3 = CONCAT26(iVar7,CONCAT24(iVar7,CONCAT22(iVar7,iVar7)));
        auVar5._10_2_ = iVar7;
        auVar5._8_2_ = iVar7;
        auVar5._12_2_ = iVar7;
        auVar5._14_2_ = iVar7;
        auVar5._0_8_ = uVar3;
        pmovzxbw(auVar5,uVar3);
        acc_stat_sse41((int32_t *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (__m128i *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
        acc_stat_sse41((int32_t *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (__m128i *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
        acc_stat_sse41((int32_t *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (__m128i *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
        acc_stat_sse41((int32_t *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (__m128i *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
        acc_stat_sse41((int32_t *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (__m128i *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
        acc_stat_sse41((int32_t *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (__m128i *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
        acc_stat_sse41((int32_t *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (__m128i *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
      }
    }
  }
  if ((in_ECX & 1) != 0) {
    bVar1 = *(byte *)(in_RSI + local_a8);
    *in_stack_00000008 = (uint)bVar1 + *in_stack_00000008;
    for (local_ac = 0; local_ac < 7; local_ac = local_ac + 1) {
      for (local_b0 = 0; local_b0 < 7; local_b0 = local_b0 + 1) {
        bVar2 = *(byte *)(in_RDI + local_a8 + (long)(local_ac * in_R8D) + (long)local_b0);
        lVar9 = kl_1[0] + (long)local_ac * 0x1c;
        *(uint *)(lVar9 + (long)local_b0 * 4) = *(int *)(lVar9 + (long)local_b0 * 4) + (uint)bVar2;
        lVar9 = kl_1[1] + (long)local_ac * 0x1c;
        *(uint *)(lVar9 + (long)local_b0 * 4) =
             *(int *)(lVar9 + (long)local_b0 * 4) + (uint)bVar2 * (uint)bVar1;
        uVar8 = (ushort)bVar2;
        uVar4 = (ulong)CONCAT14(bVar2,(uint)CONCAT12(bVar2,uVar8)) | (ulong)uVar8 << 0x30;
        auVar6._8_8_ = (ulong)CONCAT14(bVar2,(uint)CONCAT12(bVar2,uVar8)) | (ulong)uVar8 << 0x30;
        auVar6._0_8_ = uVar4;
        pmovzxbw(auVar6,uVar4);
        acc_stat_sse41((int32_t *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (__m128i *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
        acc_stat_sse41((int32_t *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (__m128i *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
        acc_stat_sse41((int32_t *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (__m128i *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
        acc_stat_sse41((int32_t *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (__m128i *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
        acc_stat_sse41((int32_t *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (__m128i *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
        acc_stat_sse41((int32_t *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (__m128i *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
        acc_stat_sse41((int32_t *)
                       CONCAT17(in_stack_ffffffffffffff3f,
                                CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (__m128i *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
      }
    }
  }
  return;
}

Assistant:

static inline void acc_stat_win7_one_line_sse4_1(
    const uint8_t *dgd, const uint8_t *src, int h_start, int h_end,
    int dgd_stride, const __m128i *shuffle, int32_t *sumX,
    int32_t sumY[WIENER_WIN][WIENER_WIN], int32_t M_int[WIENER_WIN][WIENER_WIN],
    int32_t H_int[WIENER_WIN2][WIENER_WIN * 8]) {
  const int wiener_win = 7;
  int j, k, l;
  // Main loop handles two pixels at a time
  // We can assume that h_start is even, since it will always be aligned to
  // a tile edge + some number of restoration units, and both of those will
  // be 64-pixel aligned.
  // However, at the edge of the image, h_end may be odd, so we need to handle
  // that case correctly.
  assert(h_start % 2 == 0);
  const int h_end_even = h_end & ~1;
  const int has_odd_pixel = h_end & 1;
  for (j = h_start; j < h_end_even; j += 2) {
    const uint8_t *dgd_ij = dgd + j;
    const uint8_t X1 = src[j];
    const uint8_t X2 = src[j + 1];
    *sumX += X1 + X2;
    for (k = 0; k < wiener_win; k++) {
      const uint8_t *dgd_ijk = dgd_ij + k * dgd_stride;
      for (l = 0; l < wiener_win; l++) {
        int32_t *H_ = &H_int[(l * wiener_win + k)][0];
        const uint8_t D1 = dgd_ijk[l];
        const uint8_t D2 = dgd_ijk[l + 1];
        sumY[k][l] += D1 + D2;
        M_int[k][l] += D1 * X1 + D2 * X2;

        const __m128i kl =
            _mm_cvtepu8_epi16(_mm_set1_epi16(loadu_int16(dgd_ijk + l)));
        acc_stat_sse41(H_ + 0 * 8, dgd_ij + 0 * dgd_stride, shuffle, &kl);
        acc_stat_sse41(H_ + 1 * 8, dgd_ij + 1 * dgd_stride, shuffle, &kl);
        acc_stat_sse41(H_ + 2 * 8, dgd_ij + 2 * dgd_stride, shuffle, &kl);
        acc_stat_sse41(H_ + 3 * 8, dgd_ij + 3 * dgd_stride, shuffle, &kl);
        acc_stat_sse41(H_ + 4 * 8, dgd_ij + 4 * dgd_stride, shuffle, &kl);
        acc_stat_sse41(H_ + 5 * 8, dgd_ij + 5 * dgd_stride, shuffle, &kl);
        acc_stat_sse41(H_ + 6 * 8, dgd_ij + 6 * dgd_stride, shuffle, &kl);
      }
    }
  }
  // If the width is odd, add in the final pixel
  if (has_odd_pixel) {
    const uint8_t *dgd_ij = dgd + j;
    const uint8_t X1 = src[j];
    *sumX += X1;
    for (k = 0; k < wiener_win; k++) {
      const uint8_t *dgd_ijk = dgd_ij + k * dgd_stride;
      for (l = 0; l < wiener_win; l++) {
        int32_t *H_ = &H_int[(l * wiener_win + k)][0];
        const uint8_t D1 = dgd_ijk[l];
        sumY[k][l] += D1;
        M_int[k][l] += D1 * X1;

        // The `acc_stat_sse41` function wants its input to have interleaved
        // copies of two pixels, but we only have one. However, the pixels
        // are (effectively) used as inputs to a multiply-accumulate.
        // So if we set the extra pixel slot to 0, then it is effectively
        // ignored.
        const __m128i kl = _mm_cvtepu8_epi16(_mm_set1_epi16((int16_t)D1));
        acc_stat_sse41(H_ + 0 * 8, dgd_ij + 0 * dgd_stride, shuffle, &kl);
        acc_stat_sse41(H_ + 1 * 8, dgd_ij + 1 * dgd_stride, shuffle, &kl);
        acc_stat_sse41(H_ + 2 * 8, dgd_ij + 2 * dgd_stride, shuffle, &kl);
        acc_stat_sse41(H_ + 3 * 8, dgd_ij + 3 * dgd_stride, shuffle, &kl);
        acc_stat_sse41(H_ + 4 * 8, dgd_ij + 4 * dgd_stride, shuffle, &kl);
        acc_stat_sse41(H_ + 5 * 8, dgd_ij + 5 * dgd_stride, shuffle, &kl);
        acc_stat_sse41(H_ + 6 * 8, dgd_ij + 6 * dgd_stride, shuffle, &kl);
      }
    }
  }
}